

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearrayfactory.cpp
# Opt level: O2

void __thiscall PureArrayFactory::PureArrayFactory(PureArrayFactory *this,int range,int w,int h)

{
  Array **ppAVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->_vptr_PureArrayFactory = (_func_int **)&PTR__PureArrayFactory_00104da0;
  this->_range = range;
  this->_width = w;
  this->_height = h;
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < range) {
    uVar3 = (ulong)(uint)range << 3;
  }
  uVar2 = (ulong)(uint)range;
  if (range < 1) {
    uVar2 = uVar4;
  }
  ppAVar1 = (Array **)operator_new__(uVar3);
  this->_arrays = ppAVar1;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    this->_arrays[uVar4] = (Array *)0x0;
  }
  return;
}

Assistant:

PureArrayFactory::PureArrayFactory(int range, int w, int h)
	:_range(range)
	,_width(w)
	,_height(h)
{
	_arrays = new Array*[_range];

	for (int i = 0; i < _range; ++i) {
		_arrays[i] = NULL;
	}
}